

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O2

void __thiscall
ElementsAddressFactory_CreatePegInAddress2_Test::TestBody
          (ElementsAddressFactory_CreatePegInAddress2_Test *this)

{
  bool bVar1;
  AssertHelper AStack_518;
  ElementsAddressFactory factory;
  Script fedpegscript;
  Address address;
  Script claim_script;
  Address local_300;
  Address local_188;
  
  std::__cxx11::string::string
            ((string *)&address,"76a914c3bec9f6c51c3d1f0fd00c54fe41b5d8014ed8eb88ac",
             (allocator *)&fedpegscript);
  cfd::core::Script::Script(&claim_script,(string *)&address);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)&address,
             "522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae"
             ,(allocator *)&factory);
  cfd::core::Script::Script(&fedpegscript,(string *)&address);
  std::__cxx11::string::~string((string *)&address);
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kMainnet);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::CreatePegInAddress
                (&address,&factory,kP2wshAddress,&claim_script,&fedpegscript);
      cfd::core::Address::~Address(&address);
    }
  }
  else {
    testing::Message::Message((Message *)&address);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x118,
               "Expected: Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, fedpegscript) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&AStack_518,(Message *)&address);
    testing::internal::AssertHelper::~AssertHelper(&AStack_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&address);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Script::Script((Script *)&address);
    cfd::ElementsAddressFactory::CreatePegInAddress
              (&local_188,&factory,kP2wshAddress,(Script *)&address,&fedpegscript);
    cfd::core::Address::~Address(&local_188);
    cfd::core::Script::~Script((Script *)&address);
  }
  testing::Message::Message((Message *)&address);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_518,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x11b,
             "Expected: factory.CreatePegInAddress(AddressType::kP2wshAddress, Script(), fedpegscript) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_518,(Message *)&address);
  testing::internal::AssertHelper::~AssertHelper(&AStack_518);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&address);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kRegtest);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::CreatePegInAddress
                (&address,&factory,kP2wshAddress,&claim_script,&fedpegscript);
      cfd::core::Address::~Address(&address);
    }
  }
  else {
    testing::Message::Message((Message *)&address);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x11f,
               "Expected: Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, fedpegscript) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&AStack_518,(Message *)&address);
    testing::internal::AssertHelper::~AssertHelper(&AStack_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&address);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Script::Script((Script *)&address);
    cfd::ElementsAddressFactory::CreatePegInAddress
              (&local_300,&factory,kP2wshAddress,(Script *)&address,&fedpegscript);
    cfd::core::Address::~Address(&local_300);
    cfd::core::Script::~Script((Script *)&address);
  }
  testing::Message::Message((Message *)&address);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_518,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x122,
             "Expected: factory.CreatePegInAddress(AddressType::kP2wshAddress, Script(), fedpegscript) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_518,(Message *)&address);
  testing::internal::AssertHelper::~AssertHelper(&AStack_518);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&address);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  cfd::core::Script::~Script(&fedpegscript);
  cfd::core::Script::~Script(&claim_script);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CreatePegInAddress2)
{
  Script claim_script("76a914c3bec9f6c51c3d1f0fd00c54fe41b5d8014ed8eb88ac");
  Script fedpegscript("522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae");
  {
    ElementsAddressFactory factory(NetType::kMainnet);
    EXPECT_NO_THROW(Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, fedpegscript));
    // error
    // EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, Script()), CfdException);
    EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, Script(), fedpegscript), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kRegtest);
    EXPECT_NO_THROW(Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, fedpegscript));
    // error
    // EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, claim_script, Script()), CfdException);
    EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, Script(), fedpegscript), CfdException);
  }
}